

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_quad_mesh.h
# Opt level: O2

PrimInfoMB * __thiscall
embree::sse2::QuadMeshISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,QuadMeshISA *this,mvector<PrimRefMB> *prims,
          BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  PrimRefMB *pPVar2;
  Vec3fx *pVVar3;
  BBox1f BVar4;
  long lVar5;
  BufferView<embree::Vec3fa> *pBVar6;
  char *pcVar7;
  PrimRefMB *pPVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  LBBox3fx *pLVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  undefined4 uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  size_t *psVar23;
  unsigned_long uVar24;
  size_t sVar25;
  int iVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  float fVar40;
  uint uVar41;
  float fVar42;
  uint uVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float local_220;
  float local_21c;
  ulong local_1e8;
  size_t local_1b0;
  unsigned_long local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  BBox1f local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  anon_class_16_2_4e716a3c local_100;
  ulong local_f0;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar24 = r->_begin;
  local_158.lower = 0.0;
  local_158.upper = 1.0;
  local_1a8 = 0;
  local_220 = 0.0;
  local_21c = 1.0;
  local_168._8_8_ = 0xff800000ff800000;
  local_168._0_8_ = 0xff800000ff800000;
  local_178._8_8_ = 0x7f8000007f800000;
  local_178._0_8_ = 0x7f8000007f800000;
  local_1e8 = 0;
  local_1b0 = 0;
  local_138._8_8_ = 0xff800000ff800000;
  local_138._0_8_ = 0xff800000ff800000;
  local_188._8_8_ = 0xff800000ff800000;
  local_188._0_8_ = 0xff800000ff800000;
  local_148._8_8_ = 0x7f8000007f800000;
  local_148._0_8_ = 0x7f8000007f800000;
  local_198._8_8_ = 0x7f8000007f800000;
  local_198._0_8_ = 0x7f8000007f800000;
  while( true ) {
    if (r->_end <= uVar24) {
      (__return_storage_ptr__->object_range)._end = local_1a8;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        lower.field_0 = local_198._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.lower.field_0 + 8) = local_198._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        upper.field_0 = local_188._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.upper.field_0 + 8) = local_188._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        lower.field_0 = local_178._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.lower.field_0 + 8) = local_178._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        upper.field_0 = local_168._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.upper.field_0 + 8) = local_168._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
        field_0 = local_148._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               lower.field_0 + 8) = local_148._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
        field_0 = local_138._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               upper.field_0 + 8) = local_138._8_8_;
      (__return_storage_ptr__->time_range).lower = local_21c;
      (__return_storage_ptr__->time_range).upper = local_220;
      __return_storage_ptr__->num_time_segments = local_1b0;
      __return_storage_ptr__->max_num_time_segments = local_1e8;
      __return_storage_ptr__->max_time_range = local_158;
      return __return_storage_ptr__;
    }
    BVar4 = (this->super_QuadMesh).super_Geometry.time_range;
    fVar38 = BVar4.lower;
    fVar46 = (this->super_QuadMesh).super_Geometry.fnumTimeSegments;
    fVar30 = t0t1->lower;
    fVar31 = t0t1->upper;
    fVar40 = BVar4.upper - fVar38;
    fVar28 = floorf(((fVar30 - fVar38) / fVar40) * 1.0000002 * fVar46);
    fVar29 = ceilf(((fVar31 - fVar38) / fVar40) * 0.99999976 * fVar46);
    lVar5 = *(long *)&(this->super_QuadMesh).super_Geometry.field_0x58;
    lVar21 = *(long *)&(this->super_QuadMesh).field_0x68 * uVar24;
    pBVar6 = (this->super_QuadMesh).vertices.items;
    uVar22 = (pBVar6->super_RawBufferView).num;
    if ((((*(uint *)(lVar5 + lVar21) < uVar22) &&
         (uVar16 = (ulong)*(uint *)(lVar5 + 4 + lVar21), uVar16 < uVar22)) &&
        (uVar17 = (ulong)*(uint *)(lVar5 + 8 + lVar21), uVar17 < uVar22)) &&
       (uVar20 = (ulong)*(uint *)(lVar5 + 0xc + lVar21), uVar20 < uVar22)) break;
LAB_001ecaed:
    uVar24 = uVar24 + 1;
  }
  fVar47 = 0.0;
  if (0.0 <= fVar28) {
    fVar47 = fVar28;
  }
  if (fVar46 <= fVar29) {
    fVar29 = fVar46;
  }
  psVar23 = &pBVar6[(int)fVar47].super_RawBufferView.stride;
  uVar22 = (long)(int)fVar47 - 1;
LAB_001ec6e1:
  uVar22 = uVar22 + 1;
  if ((ulong)(long)(int)fVar29 < uVar22) {
    local_100.primID = &local_f0;
    fVar28 = (fVar30 - fVar38) / fVar40;
    fVar40 = (fVar31 - fVar38) / fVar40;
    fVar29 = fVar46 * fVar40;
    local_100.this = &this->super_QuadMesh;
    local_f0 = uVar24;
    fVar30 = floorf(fVar46 * fVar28);
    fVar31 = ceilf(fVar29);
    iVar15 = (int)fVar30;
    if (fVar30 <= 0.0) {
      fVar30 = 0.0;
    }
    fVar38 = fVar31;
    if (fVar46 <= fVar31) {
      fVar38 = fVar46;
    }
    iVar26 = -1;
    if (-1 < iVar15) {
      iVar26 = iVar15;
    }
    iVar13 = (int)fVar46 + 1;
    if ((int)fVar31 < (int)fVar46 + 1) {
      iVar13 = (int)fVar31;
    }
    QuadMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
              (&blower0,&local_100,(long)(int)fVar30);
    QuadMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
              (&bupper1,&local_100,(long)(int)fVar38);
    fVar31 = fVar46 * fVar28 - fVar30;
    if (iVar13 - iVar26 == 1) {
      if (fVar31 <= 0.0) {
        fVar31 = 0.0;
      }
      fVar46 = 1.0 - fVar31;
      fVar50 = fVar46 * blower0.lower.field_0.m128[0] + fVar31 * bupper1.lower.field_0.m128[0];
      fVar51 = fVar46 * blower0.lower.field_0.m128[1] + fVar31 * bupper1.lower.field_0.m128[1];
      fVar52 = fVar46 * blower0.lower.field_0.m128[2] + fVar31 * bupper1.lower.field_0.m128[2];
      fVar30 = fVar46 * blower0.upper.field_0.m128[0] + fVar31 * bupper1.upper.field_0.m128[0];
      fVar48 = fVar46 * blower0.upper.field_0.m128[1] + fVar31 * bupper1.upper.field_0.m128[1];
      fVar49 = fVar46 * blower0.upper.field_0.m128[2] + fVar31 * bupper1.upper.field_0.m128[2];
      fVar38 = fVar38 - fVar29;
      if (fVar38 <= 0.0) {
        fVar38 = 0.0;
      }
      fVar46 = 1.0 - fVar38;
      fVar54 = bupper1.lower.field_0.m128[0] * fVar46 + blower0.lower.field_0.m128[0] * fVar38;
      fVar55 = bupper1.lower.field_0.m128[1] * fVar46 + blower0.lower.field_0.m128[1] * fVar38;
      fVar56 = bupper1.lower.field_0.m128[2] * fVar46 + blower0.lower.field_0.m128[2] * fVar38;
      fVar29 = fVar46 * bupper1.upper.field_0.m128[0] + fVar38 * blower0.upper.field_0.m128[0];
      fVar44 = fVar46 * bupper1.upper.field_0.m128[1] + fVar38 * blower0.upper.field_0.m128[1];
      fVar45 = fVar46 * bupper1.upper.field_0.m128[2] + fVar38 * blower0.upper.field_0.m128[2];
    }
    else {
      QuadMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                (&blower1,&local_100,(long)((int)fVar30 + 1));
      QuadMesh::linearBounds::anon_class_16_2_4e716a3c::operator()
                (&bupper0,&local_100,(long)((int)fVar38 + -1));
      if (fVar31 <= 0.0) {
        fVar31 = 0.0;
      }
      fVar47 = 1.0 - fVar31;
      fVar50 = blower0.lower.field_0.m128[0] * fVar47 + blower1.lower.field_0.m128[0] * fVar31;
      fVar51 = blower0.lower.field_0.m128[1] * fVar47 + blower1.lower.field_0.m128[1] * fVar31;
      fVar52 = blower0.lower.field_0.m128[2] * fVar47 + blower1.lower.field_0.m128[2] * fVar31;
      fVar53 = blower0.lower.field_0.m128[3] * fVar47 + blower1.lower.field_0.m128[3] * fVar31;
      fVar30 = fVar47 * blower0.upper.field_0.m128[0] + fVar31 * blower1.upper.field_0.m128[0];
      fVar48 = fVar47 * blower0.upper.field_0.m128[1] + fVar31 * blower1.upper.field_0.m128[1];
      fVar49 = fVar47 * blower0.upper.field_0.m128[2] + fVar31 * blower1.upper.field_0.m128[2];
      fVar31 = fVar47 * blower0.upper.field_0.m128[3] + fVar31 * blower1.upper.field_0.m128[3];
      fVar38 = fVar38 - fVar29;
      if (fVar38 <= 0.0) {
        fVar38 = 0.0;
      }
      fVar47 = 1.0 - fVar38;
      fVar54 = bupper1.lower.field_0.m128[0] * fVar47 + bupper0.lower.field_0.m128[0] * fVar38;
      fVar55 = bupper1.lower.field_0.m128[1] * fVar47 + bupper0.lower.field_0.m128[1] * fVar38;
      fVar56 = bupper1.lower.field_0.m128[2] * fVar47 + bupper0.lower.field_0.m128[2] * fVar38;
      fVar57 = bupper1.lower.field_0.m128[3] * fVar47 + bupper0.lower.field_0.m128[3] * fVar38;
      fVar29 = fVar47 * bupper1.upper.field_0.m128[0] + fVar38 * bupper0.upper.field_0.m128[0];
      fVar44 = fVar47 * bupper1.upper.field_0.m128[1] + fVar38 * bupper0.upper.field_0.m128[1];
      fVar45 = fVar47 * bupper1.upper.field_0.m128[2] + fVar38 * bupper0.upper.field_0.m128[2];
      fVar38 = fVar47 * bupper1.upper.field_0.m128[3] + fVar38 * bupper0.upper.field_0.m128[3];
      if (iVar15 < 0) {
        iVar15 = -1;
      }
      sVar25 = (size_t)iVar15;
      while (sVar25 = sVar25 + 1, (long)sVar25 < (long)iVar13) {
        fVar47 = ((float)(int)sVar25 / fVar46 - fVar28) / (fVar40 - fVar28);
        fVar42 = 1.0 - fVar47;
        QuadMesh::linearBounds::anon_class_16_2_4e716a3c::operator()(&bi,&local_100,sVar25);
        auVar37._0_4_ = bi.lower.field_0.m128[0] - (fVar50 * fVar42 + fVar54 * fVar47);
        auVar37._4_4_ = bi.lower.field_0.m128[1] - (fVar51 * fVar42 + fVar55 * fVar47);
        auVar37._8_4_ = bi.lower.field_0.m128[2] - (fVar52 * fVar42 + fVar56 * fVar47);
        auVar37._12_4_ = bi.lower.field_0.m128[3] - (fVar53 * fVar42 + fVar57 * fVar47);
        auVar39._0_4_ = bi.upper.field_0.m128[0] - (fVar42 * fVar30 + fVar47 * fVar29);
        auVar39._4_4_ = bi.upper.field_0.m128[1] - (fVar42 * fVar48 + fVar47 * fVar44);
        auVar39._8_4_ = bi.upper.field_0.m128[2] - (fVar42 * fVar49 + fVar47 * fVar45);
        auVar39._12_4_ = bi.upper.field_0.m128[3] - (fVar42 * fVar31 + fVar47 * fVar38);
        auVar37 = minps(auVar37,ZEXT816(0));
        auVar39 = maxps(auVar39,ZEXT816(0));
        fVar50 = fVar50 + auVar37._0_4_;
        fVar51 = fVar51 + auVar37._4_4_;
        fVar52 = fVar52 + auVar37._8_4_;
        fVar53 = fVar53 + auVar37._12_4_;
        fVar54 = fVar54 + auVar37._0_4_;
        fVar55 = fVar55 + auVar37._4_4_;
        fVar56 = fVar56 + auVar37._8_4_;
        fVar57 = fVar57 + auVar37._12_4_;
        fVar30 = fVar30 + auVar39._0_4_;
        fVar48 = fVar48 + auVar39._4_4_;
        fVar49 = fVar49 + auVar39._8_4_;
        fVar31 = fVar31 + auVar39._12_4_;
        fVar29 = fVar29 + auVar39._0_4_;
        fVar44 = fVar44 + auVar39._4_4_;
        fVar45 = fVar45 + auVar39._8_4_;
        fVar38 = fVar38 + auVar39._12_4_;
      }
    }
    fVar46 = (float)((this->super_QuadMesh).super_Geometry.numTimeSteps - 1);
    uVar22 = (ulong)(uint)fVar46;
    fVar31 = (float)uVar24;
    auVar36._0_4_ = fVar30 * 0.5 + fVar29 * 0.5 + fVar50 * 0.5 + fVar54 * 0.5;
    auVar36._4_4_ = fVar48 * 0.5 + fVar44 * 0.5 + fVar51 * 0.5 + fVar55 * 0.5;
    auVar36._8_4_ = fVar49 * 0.5 + fVar45 * 0.5 + fVar52 * 0.5 + fVar56 * 0.5;
    auVar36._12_4_ = fVar31 * 0.5 + fVar46 * 0.5 + (float)geomID * 0.5 + fVar46 * 0.5;
    BVar4 = (this->super_QuadMesh).super_Geometry.time_range;
    auVar11._4_4_ = fVar51;
    auVar11._0_4_ = fVar50;
    auVar11._8_4_ = fVar52;
    auVar11._12_4_ = geomID;
    local_198 = minps(local_198,auVar11);
    local_1a8 = local_1a8 + 1;
    local_1b0 = local_1b0 + uVar22;
    bVar27 = local_1e8 < uVar22;
    if (local_1e8 <= uVar22) {
      local_1e8 = uVar22;
    }
    pPVar8 = prims->items;
    pPVar2 = pPVar8 + k;
    (pPVar2->lbounds).bounds0.lower.field_0.m128[0] = fVar50;
    (pPVar2->lbounds).bounds0.lower.field_0.m128[1] = fVar51;
    (pPVar2->lbounds).bounds0.lower.field_0.m128[2] = fVar52;
    (pPVar2->lbounds).bounds0.lower.field_0.m128[3] = (float)geomID;
    auVar10._4_4_ = fVar48;
    auVar10._0_4_ = fVar30;
    auVar10._8_4_ = fVar49;
    auVar10._12_4_ = fVar31;
    local_188 = maxps(local_188,auVar10);
    pVVar3 = &pPVar8[k].lbounds.bounds0.upper;
    (pVVar3->field_0).m128[0] = fVar30;
    (pVVar3->field_0).m128[1] = fVar48;
    (pVVar3->field_0).m128[2] = fVar49;
    (pVVar3->field_0).m128[3] = fVar31;
    auVar12._4_4_ = fVar55;
    auVar12._0_4_ = fVar54;
    auVar12._8_4_ = fVar56;
    auVar12._12_4_ = fVar46;
    local_178 = minps(local_178,auVar12);
    pLVar14 = &pPVar8[k].lbounds;
    (pLVar14->bounds1).lower.field_0.m128[0] = fVar54;
    (pLVar14->bounds1).lower.field_0.m128[1] = fVar55;
    (pLVar14->bounds1).lower.field_0.m128[2] = fVar56;
    (pLVar14->bounds1).lower.field_0.m128[3] = fVar46;
    auVar9._4_4_ = fVar44;
    auVar9._0_4_ = fVar29;
    auVar9._8_4_ = fVar45;
    auVar9._12_4_ = fVar46;
    local_168 = maxps(local_168,auVar9);
    pVVar3 = &pPVar8[k].lbounds.bounds1.upper;
    (pVVar3->field_0).m128[0] = fVar29;
    (pVVar3->field_0).m128[1] = fVar44;
    (pVVar3->field_0).m128[2] = fVar45;
    (pVVar3->field_0).m128[3] = fVar46;
    pPVar8[k].time_range = BVar4;
    local_148 = minps(local_148,auVar36);
    local_138 = maxps(local_138,auVar36);
    fVar46 = BVar4.lower;
    if (fVar46 <= local_21c) {
      local_21c = fVar46;
    }
    fVar31 = BVar4.upper;
    fVar30 = fVar31;
    if (fVar31 <= local_220) {
      fVar30 = local_220;
    }
    uVar41 = (int)((uint)bVar27 << 0x1f) >> 0x1f;
    uVar43 = (int)((uint)bVar27 << 0x1f) >> 0x1f;
    k = k + 1;
    local_158.upper = (float)(~uVar43 & (uint)local_158.upper | (uint)fVar31 & uVar43);
    local_158.lower = (float)(~uVar41 & (uint)local_158.lower | (uint)fVar46 & uVar41);
    local_220 = fVar30;
  }
  else {
    pcVar7 = ((RawBufferView *)(psVar23 + -2))->ptr_ofs;
    sVar25 = *psVar23;
    lVar19 = sVar25 * *(uint *)(lVar5 + lVar21);
    pfVar1 = (float *)(pcVar7 + lVar19);
    auVar32._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
    auVar32._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
    auVar32._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
    auVar32._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
    uVar18 = movmskps((int)lVar19,auVar32);
    if ((~(byte)uVar18 & 7) == 0) {
      lVar19 = sVar25 * uVar16;
      pfVar1 = (float *)(pcVar7 + lVar19);
      auVar33._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
      auVar33._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
      auVar33._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
      auVar33._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
      uVar18 = movmskps((int)lVar19,auVar33);
      if ((~(byte)uVar18 & 7) == 0) {
        lVar19 = sVar25 * uVar17;
        pfVar1 = (float *)(pcVar7 + lVar19);
        auVar34._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
        auVar34._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
        auVar34._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
        auVar34._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
        uVar18 = movmskps((int)lVar19,auVar34);
        if ((~(byte)uVar18 & 7) == 0) goto code_r0x001ec760;
      }
    }
  }
  goto LAB_001ecaed;
code_r0x001ec760:
  psVar23 = psVar23 + 7;
  pfVar1 = (float *)(pcVar7 + sVar25 * uVar20);
  auVar35._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
  auVar35._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
  auVar35._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
  auVar35._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
  uVar18 = movmskps((int)pcVar7,auVar35);
  if ((~(byte)uVar18 & 7) != 0) goto LAB_001ecaed;
  goto LAB_001ec6e1;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const PrimRefMB prim(linearBounds(j,t0t1),this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }